

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTest::createInstance
          (BuiltinVariableRenderTest *this,Context *context)

{
  size_type *psVar1;
  bool bVar2;
  pointer pVVar3;
  Context *pCVar4;
  Handle<(vk::HandleType)8> HVar5;
  VkBool32 VVar6;
  VkResult result;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  GeometryExpanderRenderTestInstance *this_00;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar7;
  NotSupportedError *this_01;
  size_t __n;
  VkBufferCreateInfo indexBufferParams;
  Move<vk::Handle<(vk::HandleType)8>_> local_b8;
  Context **local_90;
  undefined1 local_88 [24];
  VkAllocationCallbacks *pVStack_70;
  VkBufferCreateInfo local_68;
  
  if (this->m_test == TEST_POINT_SIZE) {
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar6 = checkPointSize(vki,physDevice);
    if (VVar6 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Missing feature: pointSize",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                 ,0x45d);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0xc0);
  bVar2 = this->m_flag;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,(uint)(this->m_test == TEST_PRIMITIVE_ID_IN) * 2,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinVariableRenderTestInstance_00d7e410;
  *(bool *)&this_00[1].super_TestInstance._vptr_TestInstance = bVar2;
  local_90 = &this_00[1].super_TestInstance.m_context;
  psVar1 = &this_00[1].m_name._M_string_length;
  this_00[1].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this_00[1].m_primitiveType = 0;
  this_00[1].m_name._M_dataplus._M_p = (pointer)0x0;
  this_00[1].m_name._M_string_length = 0;
  this_00[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1].m_name.field_2 + 8) = 0;
  *(undefined8 *)&this_00[1].m_numDrawVertices = 0;
  this_00[1].m_vertexPosData.
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00->m_numDrawVertices = 5;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexPosData,5);
  pVVar3 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3->m_data[0] = 0.5;
  pVVar3->m_data[1] = 0.0;
  pVVar3->m_data[2] = 0.0;
  pVVar3->m_data[3] = 1.0;
  pVVar3 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[1].m_data[0] = 0.0;
  pVVar3[1].m_data[1] = 0.5;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 1.0;
  pVVar3 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[2].m_data[0] = -0.7;
  pVVar3[2].m_data[1] = -0.1;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 1.0;
  pVVar3 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[3].m_data[0] = -0.1;
  pVVar3[3].m_data[1] = -0.7;
  pVVar3[3].m_data[2] = 0.0;
  pVVar3[3].m_data[3] = 1.0;
  pVVar3 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[4].m_data[0] = 0.5;
  pVVar3[4].m_data[1] = 0.0;
  pVVar3[4].m_data[2] = 0.0;
  pVVar3[4].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexAttrData,(long)this_00->m_numDrawVertices);
  pVVar3 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3->m_data[0] = 0.0;
  pVVar3->m_data[1] = 0.0;
  pVVar3->m_data[2] = 0.0;
  pVVar3->m_data[3] = 0.0;
  pVVar3 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[1].m_data[0] = 1.0;
  pVVar3[1].m_data[1] = 0.0;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 0.0;
  pVVar3 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[2].m_data[0] = 2.0;
  pVVar3[2].m_data[1] = 0.0;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 0.0;
  pVVar3 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[3].m_data[0] = 3.0;
  pVVar3[3].m_data[1] = 0.0;
  pVVar3[3].m_data[2] = 0.0;
  pVVar3[3].m_data[3] = 0.0;
  pVVar3 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3[4].m_data[0] = 0.0;
  pVVar3[4].m_data[1] = 0.0;
  pVVar3[4].m_data[2] = 0.0;
  pVVar3[4].m_data[3] = 0.0;
  if (*(char *)&this_00[1].super_TestInstance._vptr_TestInstance == '\x01') {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_90,
               (long)this_00->m_numDrawVertices);
    pCVar4 = this_00[1].super_TestInstance.m_context;
    pCVar4->m_testCtx = (TestContext *)0x2ffff00040001;
    *(undefined2 *)&pCVar4->m_platformInterface = 1;
    vk = Context::getDeviceInterface((this_00->super_TestInstance).m_context);
    device = Context::getDevice((this_00->super_TestInstance).m_context);
    pAVar7 = Context::getDefaultAllocator((this_00->super_TestInstance).m_context);
    __n = *(long *)&this_00[1].m_primitiveType - (long)this_00[1].super_TestInstance.m_context;
    local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    local_68.pNext = (void *)0x0;
    local_68.flags = 0;
    local_68.usage = 0x40;
    local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_68.queueFamilyIndexCount = 0;
    local_68.pQueueFamilyIndices = (deUint32 *)0x0;
    local_68.size = __n;
    ::vk::createBuffer(&local_b8,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
    local_88._16_8_ = local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
    ;
    pVStack_70 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
    local_88._0_8_ = local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
    ;
    local_88._8_8_ =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
    local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (*psVar1 != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this_00[1].m_name.field_2,
                 (VkBuffer)*psVar1);
    }
    *(undefined8 *)((long)&this_00[1].m_name.field_2 + 8) = local_88._16_8_;
    *(VkAllocationCallbacks **)&this_00[1].m_numDrawVertices = pVStack_70;
    *psVar1 = local_88._0_8_;
    this_00[1].m_name.field_2._M_allocated_capacity = local_88._8_8_;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
    ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)local_88,vk,device,(VkBuffer)*psVar1);
    (*pAVar7->_vptr_Allocator[3])(&local_b8,pAVar7,local_88,1);
    HVar5.m_internal =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    pVVar3 = this_00[1].m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar3 != (pointer)HVar5.m_internal) {
      if (pVVar3 != (pointer)0x0) {
        (**(code **)(*(long *)pVVar3->m_data + 8))();
        this_00[1].m_vertexPosData.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      this_00[1].m_vertexPosData.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)HVar5.m_internal;
    }
    if ((long *)local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
        (long *)0x0) {
      (**(code **)(*(long *)local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                            m_internal + 8))();
      local_b8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    }
    pVVar3 = this_00[1].m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    result = (*vk->_vptr_DeviceInterface[0xc])
                       (vk,device,this_00[1].m_name._M_string_length,
                        *(undefined8 *)(pVVar3->m_data + 2),*(undefined8 *)pVVar3[1].m_data);
    ::vk::checkResult(result,
                      "vk.bindBufferMemory(device, *m_indicesBuffer, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x27a);
    memcpy(*(void **)(this_00[1].m_vertexPosData.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + 2),
           this_00[1].super_TestInstance.m_context,__n);
    pVVar3 = this_00[1].m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(pVVar3->m_data + 2),
               *(VkDeviceSize *)pVVar3[1].m_data,__n);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* BuiltinVariableRenderTest::createInstance (Context& context) const
{
	if (m_test == TEST_POINT_SIZE && !checkPointSize(context.getInstanceInterface(), context.getPhysicalDevice()))
			TCU_THROW(NotSupportedError, "Missing feature: pointSize");
	return new BuiltinVariableRenderTestInstance(context, getName(), m_test, m_flag);
}